

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O1

void find_bridges_and_articulations(void)

{
  ulong *puVar1;
  key_type *pkVar2;
  int iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  pointer piVar6;
  ulong uVar7;
  ulong uVar8;
  pair<int,_int> *bridge;
  key_type *__k;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  int cur;
  int local_44;
  int *local_40;
  int *local_38;
  
  freopen("bridges_and_articulations.txt","w",_stdout);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::used,(long)V,false);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::tin,(long)V);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::fout,(long)V);
  if (0 < V) {
    uVar8 = 0;
    do {
      if ((*(ulong *)((anonymous_namespace)::used + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) == 0) {
        dfs((int)uVar8,-1);
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)V);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bridges:",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  pkVar2 = DAT_00119200;
  for (__k = (anonymous_namespace)::bridges; __k != pkVar2; __k = __k + 2) {
    pmVar4 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,__k);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pmVar4->_M_dataplus)._M_p,pmVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    iVar3 = count_from(*__k,__k[1],true);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,") - ",4);
    pmVar4 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,__k + 1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pmVar4->_M_dataplus)._M_p,pmVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    iVar3 = count_from(__k[1],*__k,true);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Articulation points:",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_40 = DAT_001191e8;
  local_38 = (anonymous_namespace)::articulations;
  if ((anonymous_namespace)::articulations != DAT_001191e8) {
    do {
      local_44 = *local_38;
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,&local_44);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(pmVar4->_M_dataplus)._M_p,pmVar4->_M_string_length);
      iVar3 = DAT_001191a0;
      puVar1 = DAT_00119198;
      puVar10 = (anonymous_namespace)::usedcnt;
      if ((anonymous_namespace)::usedcnt != DAT_00119198) {
        memset((anonymous_namespace)::usedcnt,0,
               (long)DAT_00119198 - (long)(anonymous_namespace)::usedcnt);
        puVar10 = puVar1;
      }
      if (iVar3 != 0) {
        *puVar10 = *puVar10 & ~(0xffffffffffffffffU >> (-(char)iVar3 & 0x3fU));
      }
      lVar9 = (long)local_44;
      piVar6 = edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (edge.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar9].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
          piVar6) {
        uVar8 = 0;
        do {
          iVar3 = piVar6[uVar8];
          uVar11 = (ulong)iVar3;
          uVar7 = uVar11 + 0x3f;
          if (-1 < (long)uVar11) {
            uVar7 = uVar11;
          }
          if (((anonymous_namespace)::usedcnt
               [((long)uVar7 >> 6) +
                ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar11 & 0x3f) & 1) == 0) {
            std::vector<bool,_std::allocator<bool>_>::resize
                      ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedcnt,
                       (long)V,false);
            iVar3 = count_rec(iVar3,(int)lVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
          }
          uVar8 = uVar8 + 1;
          lVar9 = (long)local_44;
          piVar6 = edge.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar9].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
        } while (uVar8 < (ulong)((long)edge.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar6 >> 2));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      local_38 = local_38 + 1;
    } while (local_38 != local_40);
  }
  return;
}

Assistant:

void find_bridges_and_articulations() {
    freopen("bridges_and_articulations.txt", "w", stdout); // output file

    used.resize(V, false);
    tin.resize(V);
    fout.resize(V);

    for (int i = 0; i < V; i++)
        if (!used[i])
            dfs(i);
    
    cout << "Bridges:" << endl;
    for (const auto& bridge : bridges) {
        cout << name[bridge.first]
             << " (" << count_from(bridge.first, bridge.second)
             << ") - " << name[bridge.second]
             << " (" << count_from(bridge.second, bridge.first)
             << ")\n";
    }
    
    
    cout << endl << "Articulation points:" << endl;  
    for (int cur : articulations) {
        cout << name[cur];
        
        fill(usedcnt.begin(), usedcnt.end(), false);
            
        for (int j = 0; j < edge[cur].size(); j++) {
            if (!usedcnt[edge[cur][j]]) {
                int comp_size = count_from(edge[cur][j], cur, false); 
                cout << " (" << comp_size << ")";
            }
        }
        cout << endl;
    }
}